

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O1

void QtDebugUtils::formatQEnum<Qt::ApplicationState>(QDebug *debug,ApplicationState value)

{
  char *pcVar1;
  long lVar2;
  storage_type *psVar3;
  Stream *pSVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  undefined1 local_58 [24];
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
  local_58._0_16_ = QMetaObject::enumerator(0x81f858);
  lVar2 = QMetaEnum::valueToKey((ulonglong)local_58);
  pSVar4 = debug->stream;
  if (lVar2 == 0) {
    QTextStream::operator<<(&pSVar4->ts,value);
    pSVar4 = debug->stream;
    if (pSVar4->space != true) goto LAB_002cab62;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar3 + lVar2 + 1;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar5.m_data = psVar3;
    QVar5.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&pSVar4->ts,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = debug->stream;
    if (pSVar4->space == false) goto LAB_002cab62;
  }
  QTextStream::operator<<(&pSVar4->ts,' ');
LAB_002cab62:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void formatQEnum(QDebug &debug, QEnum value)
{
    const QMetaObject *metaObject = qt_getEnumMetaObject(value);
    const QMetaEnum me = metaObject->enumerator(metaObject->indexOfEnumerator(qt_getEnumName(value)));
    if (const char *key = me.valueToKey(int(value)))
        debug << key;
    else
        debug << int(value);
}